

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ArrayReverseMethod::ArrayReverseMethod(ArrayReverseMethod *this)

{
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__ArrayReverseMethod_00d7d178;
  return;
}

Assistant:

ArrayReverseMethod() : SystemSubroutine(KnownSystemName::Reverse, SubroutineKind::Function) {}